

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::matrix_svd<double,3,3>
               (Matrix<double,_3,_3> *mat_a,Matrix<double,_3,_3> *mat_u,Matrix<double,_3,_3> *mat_s,
               Matrix<double,_3,_3> *mat_v,double *epsilon)

{
  double *mat_a_00;
  double *local_70;
  double *local_68;
  double *local_60;
  int local_58;
  int local_54;
  int i;
  int x;
  double *local_48;
  double *mat_v_ptr;
  double *mat_s_ptr;
  double *mat_u_ptr;
  double *epsilon_local;
  Matrix<double,_3,_3> *mat_v_local;
  Matrix<double,_3,_3> *mat_s_local;
  Matrix<double,_3,_3> *mat_u_local;
  Matrix<double,_3,_3> *mat_a_local;
  
  mat_u_ptr = epsilon;
  epsilon_local = mat_v->m;
  mat_v_local = mat_s;
  mat_s_local = mat_u;
  mat_u_local = mat_a;
  if (mat_u == (Matrix<double,_3,_3> *)0x0) {
    local_60 = (double *)0x0;
  }
  else {
    local_60 = Matrix<double,_3,_3>::begin(mat_u);
  }
  mat_s_ptr = local_60;
  if (mat_v_local == (Matrix<double,_3,_3> *)0x0) {
    local_68 = (double *)0x0;
  }
  else {
    local_68 = Matrix<double,_3,_3>::begin(mat_v_local);
  }
  mat_v_ptr = local_68;
  if (epsilon_local == (double *)0x0) {
    local_70 = (double *)0x0;
  }
  else {
    local_70 = Matrix<double,_3,_3>::begin((Matrix<double,_3,_3> *)epsilon_local);
  }
  local_48 = local_70;
  mat_a_00 = Matrix<double,_3,_3>::begin(mat_u_local);
  matrix_svd<double>(mat_a_00,3,3,mat_s_ptr,mat_v_ptr,local_48,mat_u_ptr);
  if (mat_v_ptr != (double *)0x0) {
    _i = 0.0;
    std::fill<double*,double>(mat_v_ptr + 3,mat_v_ptr + 9,(double *)&i);
    local_58 = 4;
    for (local_54 = 1; local_54 < 3; local_54 = local_54 + 1) {
      std::swap<double>(mat_v_ptr + local_54,mat_v_ptr + local_58);
      local_58 = local_58 + 4;
    }
  }
  return;
}

Assistant:

void
matrix_svd (Matrix<T, M, N> const& mat_a, Matrix<T, M, N>* mat_u,
    Matrix<T, N, N>* mat_s, Matrix<T, N, N>* mat_v, T const& epsilon)
{
    T* mat_u_ptr = mat_u ? mat_u->begin() : nullptr;
    T* mat_s_ptr = mat_s ? mat_s->begin() : nullptr;
    T* mat_v_ptr = mat_v ? mat_v->begin() : nullptr;

    matrix_svd<T>(mat_a.begin(), M, N,
        mat_u_ptr, mat_s_ptr, mat_v_ptr, epsilon);

    /* Swap elements of S into place. */
    if (mat_s_ptr)
    {
        std::fill(mat_s_ptr + N, mat_s_ptr + N * N, T(0));
        for (int x = 1, i = N + 1; x < N; ++x, i += N + 1)
            std::swap(mat_s_ptr[x], mat_s_ptr[i]);
    }
}